

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m128i *out0;
  byte bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar23;
  undefined1 auVar24 [16];
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar28 [16];
  int iVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  uint uVar40;
  int iVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  undefined1 auVar41 [16];
  int iVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint uVar56;
  uint uVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  int iVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  uint uVar69;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar70;
  uint uVar71;
  uint uVar72;
  int iVar73;
  uint uVar74;
  int iVar77;
  uint uVar78;
  int iVar79;
  uint uVar80;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar81;
  uint uVar82;
  int iVar83;
  int iVar87;
  int iVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar89;
  int iVar90;
  int iVar92;
  int iVar93;
  undefined1 auVar91 [16];
  int iVar94;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  undefined1 auVar95 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  __m128i *out1;
  
  out0 = (__m128i *)(ulong)(uint)out_shift;
  lVar4 = (long)bit * 0x100;
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  iVar6 = -iVar9;
  iVar7 = 1 << ((char)bit - 1U & 0x1f);
  iVar8 = bd + (uint)(do_cols == 0) * 2;
  auVar13 = ZEXT416((uint)bit);
  iVar3 = 0x8000;
  if (0xf < iVar8 + 6) {
    iVar3 = 1 << ((char)iVar8 + 5U & 0x1f);
  }
  uVar5 = -iVar3;
  out1 = (__m128i *)(ulong)uVar5;
  iVar3 = iVar3 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x170);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x250);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1b0);
  auVar85._4_4_ = uVar1;
  auVar85._0_4_ = uVar1;
  auVar85._8_4_ = uVar1;
  auVar85._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x210);
  auVar91._4_4_ = uVar1;
  auVar91._0_4_ = uVar1;
  auVar91._8_4_ = uVar1;
  auVar91._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1f0);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1d0);
  auVar75._4_4_ = uVar1;
  auVar75._0_4_ = uVar1;
  auVar75._8_4_ = uVar1;
  auVar75._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x230);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 400);
  auVar86._4_4_ = uVar1;
  auVar86._0_4_ = uVar1;
  auVar86._8_4_ = uVar1;
  auVar86._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar95._4_4_ = iVar6;
  auVar95._0_4_ = iVar6;
  auVar95._8_4_ = iVar6;
  auVar95._12_4_ = iVar6;
  auVar28 = pmulld((undefined1  [16])in[7],auVar37);
  auVar19 = pmulld(auVar37,(undefined1  [16])*in);
  auVar61 = pmulld((undefined1  [16])*in,auVar62);
  auVar10 = pmulld((undefined1  [16])in[7],auVar62);
  auVar20 = pmulld((undefined1  [16])in[5],auVar85);
  auVar84 = pmulld(auVar85,(undefined1  [16])in[2]);
  auVar62 = pmulld((undefined1  [16])in[2],auVar91);
  auVar41 = pmulld((undefined1  [16])in[5],auVar91);
  auVar91 = pmulld((undefined1  [16])in[3],auVar63);
  auVar37 = pmulld(auVar63,(undefined1  [16])in[4]);
  auVar85 = pmulld((undefined1  [16])in[4],auVar75);
  auVar63 = pmulld((undefined1  [16])in[3],auVar75);
  auVar76 = pmulld((undefined1  [16])in[1],auVar50);
  auVar51 = pmulld(auVar50,(undefined1  [16])in[6]);
  auVar38 = pmulld((undefined1  [16])in[6],auVar86);
  auVar86 = pmulld((undefined1  [16])in[1],auVar86);
  iVar25 = auVar28._0_4_ + iVar7 + auVar61._0_4_ >> auVar13;
  iVar29 = auVar28._4_4_ + iVar7 + auVar61._4_4_ >> auVar13;
  iVar32 = auVar28._8_4_ + iVar7 + auVar61._8_4_ >> auVar13;
  iVar35 = auVar28._12_4_ + iVar7 + auVar61._12_4_ >> auVar13;
  iVar6 = (auVar10._0_4_ + iVar7) - auVar19._0_4_ >> auVar13;
  iVar8 = (auVar10._4_4_ + iVar7) - auVar19._4_4_ >> auVar13;
  iVar11 = (auVar10._8_4_ + iVar7) - auVar19._8_4_ >> auVar13;
  iVar12 = (auVar10._12_4_ + iVar7) - auVar19._12_4_ >> auVar13;
  iVar18 = auVar20._0_4_ + iVar7 + auVar62._0_4_ >> auVar13;
  iVar21 = auVar20._4_4_ + iVar7 + auVar62._4_4_ >> auVar13;
  iVar22 = auVar20._8_4_ + iVar7 + auVar62._8_4_ >> auVar13;
  iVar23 = auVar20._12_4_ + iVar7 + auVar62._12_4_ >> auVar13;
  iVar39 = (auVar41._0_4_ + iVar7) - auVar84._0_4_ >> auVar13;
  iVar42 = (auVar41._4_4_ + iVar7) - auVar84._4_4_ >> auVar13;
  iVar44 = (auVar41._8_4_ + iVar7) - auVar84._8_4_ >> auVar13;
  iVar46 = (auVar41._12_4_ + iVar7) - auVar84._12_4_ >> auVar13;
  iVar90 = auVar91._0_4_ + iVar7 + auVar85._0_4_ >> auVar13;
  iVar92 = auVar91._4_4_ + iVar7 + auVar85._4_4_ >> auVar13;
  iVar93 = auVar91._8_4_ + iVar7 + auVar85._8_4_ >> auVar13;
  iVar94 = auVar91._12_4_ + iVar7 + auVar85._12_4_ >> auVar13;
  iVar58 = (auVar63._0_4_ + iVar7) - auVar37._0_4_ >> auVar13;
  iVar64 = (auVar63._4_4_ + iVar7) - auVar37._4_4_ >> auVar13;
  iVar67 = (auVar63._8_4_ + iVar7) - auVar37._8_4_ >> auVar13;
  iVar70 = (auVar63._12_4_ + iVar7) - auVar37._12_4_ >> auVar13;
  iVar73 = auVar76._0_4_ + iVar7 + auVar38._0_4_ >> auVar13;
  iVar77 = auVar76._4_4_ + iVar7 + auVar38._4_4_ >> auVar13;
  iVar79 = auVar76._8_4_ + iVar7 + auVar38._8_4_ >> auVar13;
  iVar81 = auVar76._12_4_ + iVar7 + auVar38._12_4_ >> auVar13;
  iVar83 = (auVar86._0_4_ + iVar7) - auVar51._0_4_ >> auVar13;
  iVar87 = (auVar86._4_4_ + iVar7) - auVar51._4_4_ >> auVar13;
  iVar88 = (auVar86._8_4_ + iVar7) - auVar51._8_4_ >> auVar13;
  iVar89 = (auVar86._12_4_ + iVar7) - auVar51._12_4_ >> auVar13;
  iVar14 = iVar90 + iVar25;
  iVar15 = iVar92 + iVar29;
  iVar16 = iVar93 + iVar32;
  iVar17 = iVar94 + iVar35;
  iVar25 = iVar25 - iVar90;
  iVar29 = iVar29 - iVar92;
  iVar32 = iVar32 - iVar93;
  iVar35 = iVar35 - iVar94;
  uVar26 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  uVar30 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar33 = (iVar32 < (int)uVar5) * uVar5 | (uint)(iVar32 >= (int)uVar5) * iVar32;
  uVar36 = (iVar35 < (int)uVar5) * uVar5 | (uint)(iVar35 >= (int)uVar5) * iVar35;
  auVar51._0_4_ = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
  auVar51._4_4_ = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  auVar51._8_4_ = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
  auVar51._12_4_ = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
  iVar25 = iVar58 + iVar6;
  iVar29 = iVar64 + iVar8;
  iVar32 = iVar67 + iVar11;
  iVar35 = iVar70 + iVar12;
  iVar6 = iVar6 - iVar58;
  iVar8 = iVar8 - iVar64;
  iVar11 = iVar11 - iVar67;
  iVar12 = iVar12 - iVar70;
  uVar26 = (iVar6 < (int)uVar5) * uVar5 | (uint)(iVar6 >= (int)uVar5) * iVar6;
  uVar30 = (iVar8 < (int)uVar5) * uVar5 | (uint)(iVar8 >= (int)uVar5) * iVar8;
  uVar33 = (iVar11 < (int)uVar5) * uVar5 | (uint)(iVar11 >= (int)uVar5) * iVar11;
  uVar36 = (iVar12 < (int)uVar5) * uVar5 | (uint)(iVar12 >= (int)uVar5) * iVar12;
  auVar19._0_4_ = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
  auVar19._4_4_ = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  auVar19._8_4_ = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
  auVar19._12_4_ = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
  iVar6 = iVar73 + iVar18;
  iVar8 = iVar77 + iVar21;
  iVar11 = iVar79 + iVar22;
  iVar12 = iVar81 + iVar23;
  iVar18 = iVar18 - iVar73;
  iVar21 = iVar21 - iVar77;
  iVar22 = iVar22 - iVar79;
  iVar23 = iVar23 - iVar81;
  uVar26 = (iVar18 < (int)uVar5) * uVar5 | (uint)(iVar18 >= (int)uVar5) * iVar18;
  uVar30 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar33 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar36 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  auVar38._0_4_ = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
  auVar38._4_4_ = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  auVar38._8_4_ = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
  auVar38._12_4_ = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
  iVar18 = iVar83 + iVar39;
  iVar21 = iVar87 + iVar42;
  iVar22 = iVar88 + iVar44;
  iVar23 = iVar89 + iVar46;
  iVar39 = iVar39 - iVar83;
  iVar42 = iVar42 - iVar87;
  iVar44 = iVar44 - iVar88;
  iVar46 = iVar46 - iVar89;
  uVar26 = (iVar39 < (int)uVar5) * uVar5 | (uint)(iVar39 >= (int)uVar5) * iVar39;
  uVar30 = (iVar42 < (int)uVar5) * uVar5 | (uint)(iVar42 >= (int)uVar5) * iVar42;
  uVar33 = (iVar44 < (int)uVar5) * uVar5 | (uint)(iVar44 >= (int)uVar5) * iVar44;
  uVar36 = (iVar46 < (int)uVar5) * uVar5 | (uint)(iVar46 >= (int)uVar5) * iVar46;
  auVar76._0_4_ = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
  auVar76._4_4_ = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  auVar76._8_4_ = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
  auVar76._12_4_ = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
  auVar20 = pmulld(auVar51,auVar24);
  auVar61 = pmulld(auVar38,auVar95);
  auVar86 = pmulld(auVar95,auVar76);
  auVar41 = pmulld(auVar76,auVar24);
  auVar28 = pmulld(auVar38,auVar24);
  auVar37 = pmulld(auVar24,auVar19);
  auVar10._4_4_ = iVar9;
  auVar10._0_4_ = iVar9;
  auVar10._8_4_ = iVar9;
  auVar10._12_4_ = iVar9;
  auVar19 = pmulld(auVar19,auVar10);
  auVar10 = pmulld(auVar51,auVar10);
  uVar26 = (iVar14 < (int)uVar5) * uVar5 | (uint)(iVar14 >= (int)uVar5) * iVar14;
  uVar30 = (iVar15 < (int)uVar5) * uVar5 | (uint)(iVar15 >= (int)uVar5) * iVar15;
  uVar33 = (iVar16 < (int)uVar5) * uVar5 | (uint)(iVar16 >= (int)uVar5) * iVar16;
  uVar36 = (iVar17 < (int)uVar5) * uVar5 | (uint)(iVar17 >= (int)uVar5) * iVar17;
  uVar26 = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
  uVar30 = (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
  uVar33 = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
  uVar36 = (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
  uVar48 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  uVar52 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar54 = (iVar32 < (int)uVar5) * uVar5 | (uint)(iVar32 >= (int)uVar5) * iVar32;
  uVar56 = (iVar35 < (int)uVar5) * uVar5 | (uint)(iVar35 >= (int)uVar5) * iVar35;
  uVar48 = (uint)(iVar3 < (int)uVar48) * iVar3 | (iVar3 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar3 < (int)uVar56) * iVar3 | (iVar3 >= (int)uVar56) * uVar56;
  uVar59 = (iVar6 < (int)uVar5) * uVar5 | (uint)(iVar6 >= (int)uVar5) * iVar6;
  uVar65 = (iVar8 < (int)uVar5) * uVar5 | (uint)(iVar8 >= (int)uVar5) * iVar8;
  uVar68 = (iVar11 < (int)uVar5) * uVar5 | (uint)(iVar11 >= (int)uVar5) * iVar11;
  uVar71 = (iVar12 < (int)uVar5) * uVar5 | (uint)(iVar12 >= (int)uVar5) * iVar12;
  uVar59 = (uint)(iVar3 < (int)uVar59) * iVar3 | (iVar3 >= (int)uVar59) * uVar59;
  uVar65 = (uint)(iVar3 < (int)uVar65) * iVar3 | (iVar3 >= (int)uVar65) * uVar65;
  uVar68 = (uint)(iVar3 < (int)uVar68) * iVar3 | (iVar3 >= (int)uVar68) * uVar68;
  uVar71 = (uint)(iVar3 < (int)uVar71) * iVar3 | (iVar3 >= (int)uVar71) * uVar71;
  uVar74 = (iVar18 < (int)uVar5) * uVar5 | (uint)(iVar18 >= (int)uVar5) * iVar18;
  uVar78 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar80 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar82 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  iVar17 = auVar20._0_4_ + iVar7 + auVar19._0_4_ >> auVar13;
  iVar18 = auVar20._4_4_ + iVar7 + auVar19._4_4_ >> auVar13;
  iVar21 = auVar20._8_4_ + iVar7 + auVar19._8_4_ >> auVar13;
  iVar22 = auVar20._12_4_ + iVar7 + auVar19._12_4_ >> auVar13;
  iVar46 = (auVar10._0_4_ + iVar7) - auVar37._0_4_ >> auVar13;
  iVar58 = (auVar10._4_4_ + iVar7) - auVar37._4_4_ >> auVar13;
  iVar64 = (auVar10._8_4_ + iVar7) - auVar37._8_4_ >> auVar13;
  iVar67 = (auVar10._12_4_ + iVar7) - auVar37._12_4_ >> auVar13;
  iVar89 = auVar61._0_4_ + iVar7 + auVar41._0_4_ >> auVar13;
  iVar90 = auVar61._4_4_ + iVar7 + auVar41._4_4_ >> auVar13;
  iVar92 = auVar61._8_4_ + iVar7 + auVar41._8_4_ >> auVar13;
  iVar93 = auVar61._12_4_ + iVar7 + auVar41._12_4_ >> auVar13;
  iVar35 = (auVar28._0_4_ + iVar7) - auVar86._0_4_ >> auVar13;
  iVar39 = (auVar28._4_4_ + iVar7) - auVar86._4_4_ >> auVar13;
  iVar42 = (auVar28._8_4_ + iVar7) - auVar86._8_4_ >> auVar13;
  iVar44 = (auVar28._12_4_ + iVar7) - auVar86._12_4_ >> auVar13;
  uVar74 = (uint)(iVar3 < (int)uVar74) * iVar3 | (iVar3 >= (int)uVar74) * uVar74;
  uVar78 = (uint)(iVar3 < (int)uVar78) * iVar3 | (iVar3 >= (int)uVar78) * uVar78;
  uVar80 = (uint)(iVar3 < (int)uVar80) * iVar3 | (iVar3 >= (int)uVar80) * uVar80;
  uVar82 = (uint)(iVar3 < (int)uVar82) * iVar3 | (iVar3 >= (int)uVar82) * uVar82;
  iVar9 = uVar59 + uVar26;
  iVar6 = uVar65 + uVar30;
  iVar8 = uVar68 + uVar33;
  iVar11 = uVar71 + uVar36;
  iVar23 = uVar26 - uVar59;
  iVar25 = uVar30 - uVar65;
  iVar29 = uVar33 - uVar68;
  iVar32 = uVar36 - uVar71;
  iVar70 = uVar74 + uVar48;
  iVar73 = uVar78 + uVar52;
  iVar77 = uVar80 + uVar54;
  iVar79 = uVar82 + uVar56;
  iVar81 = uVar48 - uVar74;
  iVar83 = uVar52 - uVar78;
  iVar87 = uVar54 - uVar80;
  iVar88 = uVar56 - uVar82;
  iVar12 = iVar89 + iVar17;
  iVar14 = iVar90 + iVar18;
  iVar15 = iVar92 + iVar21;
  iVar16 = iVar93 + iVar22;
  iVar17 = iVar17 - iVar89;
  iVar18 = iVar18 - iVar90;
  iVar21 = iVar21 - iVar92;
  iVar22 = iVar22 - iVar93;
  iVar89 = iVar35 + iVar46;
  iVar90 = iVar39 + iVar58;
  iVar92 = iVar42 + iVar64;
  iVar93 = iVar44 + iVar67;
  iVar46 = iVar46 - iVar35;
  iVar58 = iVar58 - iVar39;
  iVar64 = iVar64 - iVar42;
  iVar67 = iVar67 - iVar44;
  uVar26 = (iVar9 < (int)uVar5) * uVar5 | (uint)(iVar9 >= (int)uVar5) * iVar9;
  uVar30 = (iVar6 < (int)uVar5) * uVar5 | (uint)(iVar6 >= (int)uVar5) * iVar6;
  uVar33 = (iVar8 < (int)uVar5) * uVar5 | (uint)(iVar8 >= (int)uVar5) * iVar8;
  uVar36 = (iVar11 < (int)uVar5) * uVar5 | (uint)(iVar11 >= (int)uVar5) * iVar11;
  uVar74 = (iVar23 < (int)uVar5) * uVar5 | (uint)(iVar23 >= (int)uVar5) * iVar23;
  uVar78 = (iVar25 < (int)uVar5) * uVar5 | (uint)(iVar25 >= (int)uVar5) * iVar25;
  uVar80 = (iVar29 < (int)uVar5) * uVar5 | (uint)(iVar29 >= (int)uVar5) * iVar29;
  uVar82 = (iVar32 < (int)uVar5) * uVar5 | (uint)(iVar32 >= (int)uVar5) * iVar32;
  uVar40 = (iVar70 < (int)uVar5) * uVar5 | (uint)(iVar70 >= (int)uVar5) * iVar70;
  uVar43 = (iVar73 < (int)uVar5) * uVar5 | (uint)(iVar73 >= (int)uVar5) * iVar73;
  uVar45 = (iVar77 < (int)uVar5) * uVar5 | (uint)(iVar77 >= (int)uVar5) * iVar77;
  uVar47 = (iVar79 < (int)uVar5) * uVar5 | (uint)(iVar79 >= (int)uVar5) * iVar79;
  uVar49 = (iVar81 < (int)uVar5) * uVar5 | (uint)(iVar81 >= (int)uVar5) * iVar81;
  uVar53 = (iVar83 < (int)uVar5) * uVar5 | (uint)(iVar83 >= (int)uVar5) * iVar83;
  uVar55 = (iVar87 < (int)uVar5) * uVar5 | (uint)(iVar87 >= (int)uVar5) * iVar87;
  uVar57 = (iVar88 < (int)uVar5) * uVar5 | (uint)(iVar88 >= (int)uVar5) * iVar88;
  uVar48 = (iVar12 < (int)uVar5) * uVar5 | (uint)(iVar12 >= (int)uVar5) * iVar12;
  uVar52 = (iVar14 < (int)uVar5) * uVar5 | (uint)(iVar14 >= (int)uVar5) * iVar14;
  uVar54 = (iVar15 < (int)uVar5) * uVar5 | (uint)(iVar15 >= (int)uVar5) * iVar15;
  uVar56 = (iVar16 < (int)uVar5) * uVar5 | (uint)(iVar16 >= (int)uVar5) * iVar16;
  uVar59 = (iVar17 < (int)uVar5) * uVar5 | (uint)(iVar17 >= (int)uVar5) * iVar17;
  uVar65 = (iVar18 < (int)uVar5) * uVar5 | (uint)(iVar18 >= (int)uVar5) * iVar18;
  uVar68 = (iVar21 < (int)uVar5) * uVar5 | (uint)(iVar21 >= (int)uVar5) * iVar21;
  uVar71 = (iVar22 < (int)uVar5) * uVar5 | (uint)(iVar22 >= (int)uVar5) * iVar22;
  uVar60 = (iVar89 < (int)uVar5) * uVar5 | (uint)(iVar89 >= (int)uVar5) * iVar89;
  uVar66 = (iVar90 < (int)uVar5) * uVar5 | (uint)(iVar90 >= (int)uVar5) * iVar90;
  uVar69 = (iVar92 < (int)uVar5) * uVar5 | (uint)(iVar92 >= (int)uVar5) * iVar92;
  uVar72 = (iVar93 < (int)uVar5) * uVar5 | (uint)(iVar93 >= (int)uVar5) * iVar93;
  uVar27 = (iVar46 < (int)uVar5) * uVar5 | (uint)(iVar46 >= (int)uVar5) * iVar46;
  uVar31 = (iVar58 < (int)uVar5) * uVar5 | (uint)(iVar58 >= (int)uVar5) * iVar58;
  uVar34 = (iVar64 < (int)uVar5) * uVar5 | (uint)(iVar64 >= (int)uVar5) * iVar64;
  uVar5 = (iVar67 < (int)uVar5) * uVar5 | (uint)(iVar67 >= (int)uVar5) * iVar67;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar28._0_4_ = (uint)(iVar3 < (int)uVar74) * iVar3 | (iVar3 >= (int)uVar74) * uVar74;
  auVar28._4_4_ = (uint)(iVar3 < (int)uVar78) * iVar3 | (iVar3 >= (int)uVar78) * uVar78;
  auVar28._8_4_ = (uint)(iVar3 < (int)uVar80) * iVar3 | (iVar3 >= (int)uVar80) * uVar80;
  auVar28._12_4_ = (uint)(iVar3 < (int)uVar82) * iVar3 | (iVar3 >= (int)uVar82) * uVar82;
  uVar74 = (uint)(iVar3 < (int)uVar40) * iVar3 | (iVar3 >= (int)uVar40) * uVar40;
  uVar78 = (uint)(iVar3 < (int)uVar43) * iVar3 | (iVar3 >= (int)uVar43) * uVar43;
  uVar80 = (uint)(iVar3 < (int)uVar45) * iVar3 | (iVar3 >= (int)uVar45) * uVar45;
  uVar82 = (uint)(iVar3 < (int)uVar47) * iVar3 | (iVar3 >= (int)uVar47) * uVar47;
  auVar84._0_4_ = (uint)(iVar3 < (int)uVar49) * iVar3 | (iVar3 >= (int)uVar49) * uVar49;
  auVar84._4_4_ = (uint)(iVar3 < (int)uVar53) * iVar3 | (iVar3 >= (int)uVar53) * uVar53;
  auVar84._8_4_ = (uint)(iVar3 < (int)uVar55) * iVar3 | (iVar3 >= (int)uVar55) * uVar55;
  auVar84._12_4_ = (uint)(iVar3 < (int)uVar57) * iVar3 | (iVar3 >= (int)uVar57) * uVar57;
  auVar20._0_4_ = (uint)(iVar3 < (int)uVar59) * iVar3 | (iVar3 >= (int)uVar59) * uVar59;
  auVar20._4_4_ = (uint)(iVar3 < (int)uVar65) * iVar3 | (iVar3 >= (int)uVar65) * uVar65;
  auVar20._8_4_ = (uint)(iVar3 < (int)uVar68) * iVar3 | (iVar3 >= (int)uVar68) * uVar68;
  auVar20._12_4_ = (uint)(iVar3 < (int)uVar71) * iVar3 | (iVar3 >= (int)uVar71) * uVar71;
  uVar59 = (uint)(iVar3 < (int)uVar60) * iVar3 | (iVar3 >= (int)uVar60) * uVar60;
  auVar61._0_4_ = (uint)(iVar3 < (int)uVar27) * iVar3 | (iVar3 >= (int)uVar27) * uVar27;
  auVar61._4_4_ = (uint)(iVar3 < (int)uVar31) * iVar3 | (iVar3 >= (int)uVar31) * uVar31;
  auVar61._8_4_ = (uint)(iVar3 < (int)uVar34) * iVar3 | (iVar3 >= (int)uVar34) * uVar34;
  auVar61._12_4_ = (uint)(iVar3 < (int)uVar5) * iVar3 | (iVar3 >= (int)uVar5) * uVar5;
  auVar10 = pmulld(auVar28,auVar41);
  auVar28 = pmulld(auVar84,auVar41);
  iVar11 = auVar10._0_4_ + iVar7;
  iVar12 = auVar10._4_4_ + iVar7;
  iVar14 = auVar10._8_4_ + iVar7;
  iVar15 = auVar10._12_4_ + iVar7;
  auVar10 = pmulld(auVar20,auVar41);
  auVar19 = pmulld(auVar61,auVar41);
  iVar9 = auVar10._0_4_ + iVar7;
  iVar6 = auVar10._4_4_ + iVar7;
  iVar8 = auVar10._8_4_ + iVar7;
  iVar7 = auVar10._12_4_ + iVar7;
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    iVar9 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar9;
    clamp_hi_out[0]._0_4_ = iVar9 + -1;
    auVar13._0_8_ = (__m128i *)CONCAT44(uVar78,uVar74);
    auVar13._8_4_ = uVar80;
    auVar13._12_4_ = uVar82;
    in1[1] = (longlong)clamp_hi_out;
    in1[0] = (longlong)clamp_lo_out;
    in0[1] = (longlong)(out + 1);
    in0[0] = (longlong)out;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0,in1,out0,out1,auVar13._0_8_,auVar13._8_8_,uVar59);
    in1_00[1] = (longlong)clamp_hi_out;
    in1_00[0] = (longlong)clamp_lo_out;
    in0_00[1] = (longlong)(out + 3);
    in0_00[0] = (longlong)(out + 2);
    neg_shift_sse4_1(in0_00,in1_00,out0,out1,auVar13._0_8_,auVar13._8_8_,uVar59);
    in1_01[1] = (longlong)clamp_hi_out;
    in1_01[0] = (longlong)clamp_lo_out;
    in0_01[1] = (longlong)(out + 5);
    in0_01[0] = (longlong)(out + 4);
    neg_shift_sse4_1(in0_01,in1_01,out0,out1,auVar13._0_8_,auVar13._8_8_,uVar59);
    in1_02[1] = (longlong)clamp_hi_out;
    in1_02[0] = (longlong)clamp_lo_out;
    in0_02[1] = (longlong)(out + 7);
    in0_02[0] = (longlong)(out + 6);
    neg_shift_sse4_1(in0_02,in1_02,out0,out1,auVar13._0_8_,auVar13._8_8_,uVar59);
  }
  else {
    *(uint *)*out = (uint)(iVar3 < (int)uVar26) * iVar3 | (iVar3 >= (int)uVar26) * uVar26;
    *(uint *)((long)*out + 4) =
         (uint)(iVar3 < (int)uVar30) * iVar3 | (iVar3 >= (int)uVar30) * uVar30;
    *(uint *)(*out + 1) = (uint)(iVar3 < (int)uVar33) * iVar3 | (iVar3 >= (int)uVar33) * uVar33;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar3 < (int)uVar36) * iVar3 | (iVar3 >= (int)uVar36) * uVar36;
    *(uint *)out[1] = -((uint)(iVar3 < (int)uVar48) * iVar3 | (iVar3 >= (int)uVar48) * uVar48);
    *(uint *)((long)out[1] + 4) =
         -((uint)(iVar3 < (int)uVar52) * iVar3 | (iVar3 >= (int)uVar52) * uVar52);
    *(uint *)(out[1] + 1) = -((uint)(iVar3 < (int)uVar54) * iVar3 | (iVar3 >= (int)uVar54) * uVar54)
    ;
    *(uint *)((long)out[1] + 0xc) =
         -((uint)(iVar3 < (int)uVar56) * iVar3 | (iVar3 >= (int)uVar56) * uVar56);
    *(int *)out[2] = iVar9 + auVar19._0_4_ >> auVar13;
    *(int *)((long)out[2] + 4) = iVar6 + auVar19._4_4_ >> auVar13;
    *(int *)(out[2] + 1) = iVar8 + auVar19._8_4_ >> auVar13;
    *(int *)((long)out[2] + 0xc) = iVar7 + auVar19._12_4_ >> auVar13;
    *(int *)out[3] = -(iVar11 + auVar28._0_4_ >> auVar13);
    *(int *)((long)out[3] + 4) = -(iVar12 + auVar28._4_4_ >> auVar13);
    *(int *)(out[3] + 1) = -(iVar14 + auVar28._8_4_ >> auVar13);
    *(int *)((long)out[3] + 0xc) = -(iVar15 + auVar28._12_4_ >> auVar13);
    *(int *)out[4] = iVar11 - auVar28._0_4_ >> auVar13;
    *(int *)((long)out[4] + 4) = iVar12 - auVar28._4_4_ >> auVar13;
    *(int *)(out[4] + 1) = iVar14 - auVar28._8_4_ >> auVar13;
    *(int *)((long)out[4] + 0xc) = iVar15 - auVar28._12_4_ >> auVar13;
    *(int *)out[5] = -(iVar9 - auVar19._0_4_ >> auVar13);
    *(int *)((long)out[5] + 4) = -(iVar6 - auVar19._4_4_ >> auVar13);
    *(int *)(out[5] + 1) = -(iVar8 - auVar19._8_4_ >> auVar13);
    *(int *)((long)out[5] + 0xc) = -(iVar7 - auVar19._12_4_ >> auVar13);
    *(uint *)out[6] = uVar59;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar3 < (int)uVar66) * iVar3 | (iVar3 >= (int)uVar66) * uVar66;
    *(uint *)(out[6] + 1) = (uint)(iVar3 < (int)uVar69) * iVar3 | (iVar3 >= (int)uVar69) * uVar69;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar3 < (int)uVar72) * iVar3 | (iVar3 >= (int)uVar72) * uVar72;
    *(uint *)out[7] = -uVar74;
    *(uint *)((long)out[7] + 4) = -uVar78;
    *(uint *)(out[7] + 1) = -uVar80;
    *(uint *)((long)out[7] + 0xc) = -uVar82;
  }
  return;
}

Assistant:

static void iadst8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm_mullo_epi32(in[7], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[7], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[5], cospi20);
  x = _mm_mullo_epi32(in[2], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[5], cospi44);
  x = _mm_mullo_epi32(in[2], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[3], cospi36);
  x = _mm_mullo_epi32(in[4], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[3], cospi28);
  x = _mm_mullo_epi32(in[4], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[1], cospi52);
  x = _mm_mullo_epi32(in[6], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[1], cospi12);
  x = _mm_mullo_epi32(in[6], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}